

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O3

Triple * __thiscall
llvm::Triple::getLittleEndianArchVariant(Triple *__return_storage_ptr__,Triple *this)

{
  pointer pcVar1;
  ObjectFormatType OVar2;
  SubArchType SVar3;
  VendorType VVar4;
  OSType OVar5;
  size_t sVar6;
  char *pcVar7;
  StringRef Str;
  
  (__return_storage_ptr__->Data)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Data).field_2
  ;
  pcVar1 = (this->Data)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->Data)._M_string_length);
  OVar2 = this->ObjectFormat;
  __return_storage_ptr__->Environment = this->Environment;
  __return_storage_ptr__->ObjectFormat = OVar2;
  SVar3 = this->SubArch;
  VVar4 = this->Vendor;
  OVar5 = this->OS;
  __return_storage_ptr__->Arch = this->Arch;
  __return_storage_ptr__->SubArch = SVar3;
  __return_storage_ptr__->Vendor = VVar4;
  __return_storage_ptr__->OS = OVar5;
  switch(this->Arch) {
  case UnknownArch:
  case armeb:
  case ppc:
  case sparcv9:
  case systemz:
  case thumbeb:
  case lanai:
    pcVar7 = "unknown";
    goto LAB_001aae30;
  case arm:
  case aarch64:
  case avr:
  case bpfel:
  case hexagon:
  case mipsel:
  case mips64el:
  case msp430:
  case nios2:
  case ppc64le:
  case r600:
  case amdgcn:
  case riscv32:
  case riscv64:
  case sparcel:
  case tcele:
  case thumb:
  case x86:
  case x86_64:
  case xcore:
  case nvptx:
  case nvptx64:
  case le32:
  case le64:
  case amdil:
  case amdil64:
  case hsail:
  case hsail64:
  case spir:
  case spir64:
  case kalimba:
  case shave:
  case wasm32:
  case wasm64:
  case renderscript32:
  case LastArchType:
    goto switchD_001aae27_caseD_1;
  case aarch64_be:
    pcVar7 = "aarch64";
    goto LAB_001aae30;
  default:
    llvm_unreachable_internal
              ("getLittleEndianArchVariant: unknown triple.",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
               ,0x5bb);
  case bpfeb:
    pcVar7 = "bpfel";
    goto LAB_001aae7d;
  case mips:
    pcVar7 = "mipsel";
    sVar6 = 6;
    break;
  case mips64:
    pcVar7 = "mips64el";
    sVar6 = 8;
    break;
  case ppc64:
    pcVar7 = "powerpc64le";
    sVar6 = 0xb;
    break;
  case sparc:
    pcVar7 = "sparcel";
LAB_001aae30:
    sVar6 = 7;
    break;
  case tce:
    pcVar7 = "tcele";
LAB_001aae7d:
    sVar6 = 5;
  }
  Str.Length = sVar6;
  Str.Data = pcVar7;
  setArchName(__return_storage_ptr__,Str);
switchD_001aae27_caseD_1:
  return __return_storage_ptr__;
}

Assistant:

Triple Triple::getLittleEndianArchVariant() const {
  Triple T(*this);
  if (isLittleEndian())
    return T;

  switch (getArch()) {
  case Triple::UnknownArch:
  case Triple::lanai:
  case Triple::ppc:
  case Triple::sparcv9:
  case Triple::systemz:

  // ARM is intentionally unsupported here, changing the architecture would
  // drop any arch suffixes.
  case Triple::armeb:
  case Triple::thumbeb:
    T.setArch(UnknownArch);
    break;

  case Triple::tce:        T.setArch(Triple::tcele);    break;
  case Triple::aarch64_be: T.setArch(Triple::aarch64);  break;
  case Triple::bpfeb:      T.setArch(Triple::bpfel);    break;
  case Triple::mips64:     T.setArch(Triple::mips64el); break;
  case Triple::mips:       T.setArch(Triple::mipsel);   break;
  case Triple::ppc64:      T.setArch(Triple::ppc64le);  break;
  case Triple::sparc:      T.setArch(Triple::sparcel);  break;
  default:
    llvm_unreachable("getLittleEndianArchVariant: unknown triple.");
  }
  return T;
}